

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionComplete.c
# Opt level: O2

int UpnpActionComplete_assign(UpnpActionComplete *p,UpnpActionComplete *q)

{
  IXML_Document *pIVar1;
  int iVar2;
  
  if (p != q) {
    p->m_ErrCode = q->m_ErrCode;
    iVar2 = UpnpActionComplete_set_CtrlUrl(p,q->m_CtrlUrl);
    if (iVar2 != 0) {
      pIVar1 = q->m_ActionResult;
      p->m_ActionRequest = q->m_ActionRequest;
      p->m_ActionResult = pIVar1;
    }
    return (uint)(iVar2 != 0);
  }
  return 1;
}

Assistant:

int UpnpActionComplete_assign(
	UpnpActionComplete *p, const UpnpActionComplete *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionComplete_set_ErrCode(
				   p, UpnpActionComplete_get_ErrCode(q));
		ok = ok && UpnpActionComplete_set_CtrlUrl(
				   p, UpnpActionComplete_get_CtrlUrl(q));
		ok = ok && UpnpActionComplete_set_ActionRequest(
				   p, UpnpActionComplete_get_ActionRequest(q));
		ok = ok && UpnpActionComplete_set_ActionResult(
				   p, UpnpActionComplete_get_ActionResult(q));
	}

	return ok;
}